

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fxload(ASMState *as,IRIns *ir)

{
  IRIns *in_RSI;
  ASMState *in_RDI;
  x86Op xo;
  Reg dest;
  IRIns *in_stack_ffffffffffffffc8;
  ASMState *pAVar1;
  IRIns *ir_00;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  x86Op local_18;
  Reg local_14;
  
  uVar2 = true;
  if (((in_RSI->field_1).t.irt & 0x1f) != 0xe) {
    uVar2 = ((in_RSI->field_1).t.irt & 0x1f) == 0xd;
  }
  pAVar1 = in_RDI;
  ir_00 = in_RSI;
  local_14 = ra_dest(in_RDI,in_stack_ffffffffffffffc8,0);
  if ((in_RSI->field_1).o == 'D') {
    asm_fusefref((ASMState *)CONCAT17(uVar2,in_stack_ffffffffffffffe0),ir_00,
                 (RegSet)((ulong)pAVar1 >> 0x20));
  }
  else {
    asm_fusexref((ASMState *)CONCAT17(uVar2,in_stack_ffffffffffffffe0),(IRRef)((ulong)ir_00 >> 0x20)
                 ,(RegSet)ir_00);
  }
  switch((in_RSI->field_1).t.irt & 0x1f) {
  case 0xd:
    local_18 = XO_MOVSS;
    break;
  case 0xe:
    local_18 = XO_MOVSD;
    break;
  case 0xf:
    local_18 = XO_MOVSXb;
    break;
  case 0x10:
    local_18 = XO_MOVZXb;
    break;
  case 0x11:
    local_18 = XO_MOVSXw;
    break;
  case 0x12:
    local_18 = XO_MOVZXw;
    break;
  default:
    if ((0x604208U >> ((in_RSI->field_1).t.irt & 0x1f) & 1) != 0) {
      local_14 = local_14 | 0x80200;
    }
    local_18 = XO_MOV;
  }
  emit_mrm(in_RDI,local_18,local_14,0x20);
  return;
}

Assistant:

static void asm_fxload(ASMState *as, IRIns *ir)
{
  Reg dest = ra_dest(as, ir, irt_isfp(ir->t) ? RSET_FPR : RSET_GPR);
  x86Op xo;
  if (ir->o == IR_FLOAD)
    asm_fusefref(as, ir, RSET_GPR);
  else
    asm_fusexref(as, ir->op1, RSET_GPR);
  /* ir->op2 is ignored -- unaligned loads are ok on x86. */
  switch (irt_type(ir->t)) {
  case IRT_I8: xo = XO_MOVSXb; break;
  case IRT_U8: xo = XO_MOVZXb; break;
  case IRT_I16: xo = XO_MOVSXw; break;
  case IRT_U16: xo = XO_MOVZXw; break;
  case IRT_NUM: xo = XO_MOVSD; break;
  case IRT_FLOAT: xo = XO_MOVSS; break;
  default:
    if (LJ_64 && irt_is64(ir->t))
      dest |= REX_64;
    else
      lj_assertA(irt_isint(ir->t) || irt_isu32(ir->t) || irt_isaddr(ir->t),
		 "unsplit 64 bit load");
    xo = XO_MOV;
    break;
  }
  emit_mrm(as, xo, dest, RID_MRM);
}